

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void property_sel_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value *new_value)

{
  Am_Object AStack_38;
  Am_Value local_30;
  Am_Value local_20;
  
  Am_Object::Am_Object(&AStack_38,command_obj);
  Am_Value::Am_Value(&local_20,new_sel);
  Am_Value::Am_Value(&local_30,new_value);
  change_property_general_undo_redo(&AStack_38,false,true,true,&local_20,&local_30);
  Am_Value::~Am_Value(&local_30);
  Am_Value::~Am_Value(&local_20);
  Am_Object::~Am_Object(&AStack_38);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void, property_sel_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel, Am_Value new_value))
{
  change_property_general_undo_redo(command_obj, false, true, true, new_sel,
                                    new_value);
}